

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lookup_keyword(char *s)

{
  int iVar1;
  char *__s1;
  
  if ((byte)*s - 99 < 0x15) {
    __s1 = s + 1;
    switch((uint)(byte)*s) {
    case 99:
      iVar1 = strcmp(__s1,"opy");
      if (iVar1 == 0) {
        return 0x25;
      }
      iVar1 = strcmp(__s1,"apability");
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = strcmp(__s1,"hdir");
      if (iVar1 == 0) {
        return 2;
      }
      iVar1 = strcmp(__s1,"hroot");
      if (iVar1 == 0) {
        return 3;
      }
      iVar1 = strcmp(__s1,"lass");
      if (iVar1 == 0) {
        return 4;
      }
      iVar1 = strcmp(__s1,"lass_start");
      if (iVar1 == 0) {
        return 5;
      }
      iVar1 = strcmp(__s1,"lass_stop");
      if (iVar1 == 0) {
        return 6;
      }
      iVar1 = strcmp(__s1,"onsole");
      if (iVar1 == 0) {
        return 7;
      }
      iVar1 = strcmp(__s1,"hown");
      if (iVar1 == 0) {
        return 0x26;
      }
      iVar1 = strcmp(__s1,"hmod");
      if (iVar1 == 0) {
        return 0x27;
      }
      iVar1 = strcmp(__s1,"ritical");
      if (iVar1 == 0) {
        return 8;
      }
      break;
    case 100:
      iVar1 = strcmp(__s1,"isabled");
      if (iVar1 == 0) {
        return 9;
      }
      iVar1 = strcmp(__s1,"omainname");
      if (iVar1 == 0) {
        return 10;
      }
      iVar1 = strcmp(__s1,"evice");
      if (iVar1 == 0) {
        return 0x2a;
      }
      break;
    case 0x65:
      iVar1 = strcmp(__s1,"xec");
      if (iVar1 == 0) {
        return 0xb;
      }
      iVar1 = strcmp(__s1,"xport");
      if (iVar1 == 0) {
        return 0xc;
      }
      break;
    case 0x67:
      iVar1 = strcmp(__s1,"roup");
      if (iVar1 == 0) {
        return 0xd;
      }
      break;
    case 0x68:
      iVar1 = strcmp(__s1,"ostname");
      if (iVar1 == 0) {
        return 0xe;
      }
      break;
    case 0x69:
      iVar1 = strcmp(__s1,"fup");
      if (iVar1 == 0) {
        return 0xf;
      }
      iVar1 = strcmp(__s1,"nsmod");
      if (iVar1 == 0) {
        return 0x10;
      }
      iVar1 = strcmp(__s1,"mport");
      if (iVar1 == 0) {
        return 0x11;
      }
      break;
    case 0x6b:
      iVar1 = strcmp(__s1,"eycodes");
      if (iVar1 == 0) {
        return 0x12;
      }
      break;
    case 0x6c:
      iVar1 = strcmp(__s1,"oglevel");
      if (iVar1 == 0) {
        return 0x29;
      }
      break;
    case 0x6d:
      iVar1 = strcmp(__s1,"kdir");
      if (iVar1 == 0) {
        return 0x13;
      }
      iVar1 = strcmp(__s1,"ount");
      if (iVar1 == 0) {
        return 0x14;
      }
      iVar1 = strcmp(__s1,"knod");
      if (iVar1 == 0) {
        return 0x28;
      }
      break;
    case 0x6f:
      iVar1 = strcmp(__s1,"n");
      if (iVar1 == 0) {
        return 0x15;
      }
      iVar1 = strcmp(__s1,"neshot");
      if (iVar1 == 0) {
        return 0x16;
      }
      iVar1 = strcmp(__s1,"nrestart");
      if (iVar1 == 0) {
        return 0x17;
      }
      break;
    case 0x72:
      iVar1 = strcmp(__s1,"estart");
      if (iVar1 == 0) {
        return 0x18;
      }
      break;
    case 0x73:
      iVar1 = strcmp(__s1,"ervice");
      if (iVar1 == 0) {
        return 0x19;
      }
      iVar1 = strcmp(__s1,"etenv");
      if (iVar1 == 0) {
        return 0x1a;
      }
      iVar1 = strcmp(__s1,"etkey");
      if (iVar1 == 0) {
        return 0x1b;
      }
      iVar1 = strcmp(__s1,"etrlimit");
      if (iVar1 == 0) {
        return 0x1c;
      }
      iVar1 = strcmp(__s1,"ocket");
      if (iVar1 == 0) {
        return 0x1d;
      }
      iVar1 = strcmp(__s1,"tart");
      if (iVar1 == 0) {
        return 0x1e;
      }
      iVar1 = strcmp(__s1,"top");
      if (iVar1 == 0) {
        return 0x1f;
      }
      iVar1 = strcmp(__s1,"ymlink");
      if (iVar1 == 0) {
        return 0x21;
      }
      iVar1 = strcmp(__s1,"ysclktz");
      if (iVar1 == 0) {
        return 0x22;
      }
      break;
    case 0x74:
      iVar1 = strcmp(__s1,"rigger");
      if (iVar1 == 0) {
        return 0x20;
      }
      break;
    case 0x75:
      iVar1 = strcmp(__s1,"ser");
      if (iVar1 == 0) {
        return 0x23;
      }
      break;
    case 0x77:
      iVar1 = strcmp(__s1,"rite");
      if (iVar1 == 0) {
        return 0x24;
      }
    }
  }
  return 0;
}

Assistant:

int lookup_keyword(const char *s)
{
    switch (*s++) {
    case 'c':
	if (!strcmp(s, "opy")) return K_copy;
        if (!strcmp(s, "apability")) return K_capability;
        if (!strcmp(s, "hdir")) return K_chdir;
        if (!strcmp(s, "hroot")) return K_chroot;
        if (!strcmp(s, "lass")) return K_class;
        if (!strcmp(s, "lass_start")) return K_class_start;
        if (!strcmp(s, "lass_stop")) return K_class_stop;
        if (!strcmp(s, "onsole")) return K_console;
        if (!strcmp(s, "hown")) return K_chown;
        if (!strcmp(s, "hmod")) return K_chmod;
        if (!strcmp(s, "ritical")) return K_critical;
        break;
    case 'd':
        if (!strcmp(s, "isabled")) return K_disabled;
        if (!strcmp(s, "omainname")) return K_domainname;
        if (!strcmp(s, "evice")) return K_device;
        break;
    case 'e':
        if (!strcmp(s, "xec")) return K_exec;
        if (!strcmp(s, "xport")) return K_export;
        break;
    case 'g':
        if (!strcmp(s, "roup")) return K_group;
        break;
    case 'h':
        if (!strcmp(s, "ostname")) return K_hostname;
        break;
    case 'i':
        if (!strcmp(s, "fup")) return K_ifup;
        if (!strcmp(s, "nsmod")) return K_insmod;
        if (!strcmp(s, "mport")) return K_import;
        break;
    case 'k':
        if (!strcmp(s, "eycodes")) return K_keycodes;
        break;
    case 'l':
        if (!strcmp(s, "oglevel")) return K_loglevel;
        break;
    case 'm':
        if (!strcmp(s, "kdir")) return K_mkdir;
        if (!strcmp(s, "ount")) return K_mount;
        if (!strcmp(s, "knod")) return K_mknod;
        break;
    case 'o':
        if (!strcmp(s, "n")) return K_on;
        if (!strcmp(s, "neshot")) return K_oneshot;
        if (!strcmp(s, "nrestart")) return K_onrestart;
        break;
    case 'r':
        if (!strcmp(s, "estart")) return K_restart;
        break;
    case 's':
        if (!strcmp(s, "ervice")) return K_service;
        if (!strcmp(s, "etenv")) return K_setenv;
        if (!strcmp(s, "etkey")) return K_setkey;
        if (!strcmp(s, "etrlimit")) return K_setrlimit;
        if (!strcmp(s, "ocket")) return K_socket;
        if (!strcmp(s, "tart")) return K_start;
        if (!strcmp(s, "top")) return K_stop;
        if (!strcmp(s, "ymlink")) return K_symlink;
        if (!strcmp(s, "ysclktz")) return K_sysclktz;
        break;
    case 't':
        if (!strcmp(s, "rigger")) return K_trigger;
        break;
    case 'u':
        if (!strcmp(s, "ser")) return K_user;
        break;
    case 'w':
        if (!strcmp(s, "rite")) return K_write;
        break;
    }
    return K_UNKNOWN;
}